

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Result * __thiscall Catch::clara::detail::Opt::validate(Result *__return_storage_ptr__,Opt *this)

{
  pointer pbVar1;
  _Alloc_hider *p_Var2;
  pointer pbVar3;
  allocator<char> local_29;
  string local_28;
  
  pbVar3 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 == pbVar1) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"No options supplied to Opt",&local_29);
    BasicResult<void>::logicError(__return_storage_ptr__,&local_28);
  }
  else {
    do {
      if (pbVar3 == pbVar1) {
        (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase.m_type = Ok;
        (__return_storage_ptr__->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
             (_func_int **)&PTR__BasicResult_00188210;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
        (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
        (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      if (pbVar3->_M_string_length == 0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_28,"Option name cannot be empty",&local_29);
        BasicResult<void>::logicError(__return_storage_ptr__,&local_28);
        goto LAB_00137a1d;
      }
      p_Var2 = &pbVar3->_M_dataplus;
      pbVar3 = pbVar3 + 1;
    } while (*p_Var2->_M_p == '-');
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"Option name must begin with \'-\'",&local_29);
    BasicResult<void>::logicError(__return_storage_ptr__,&local_28);
  }
LAB_00137a1d:
  ::std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

auto validate() const -> Result override {
            if( m_optNames.empty() )
                return Result::logicError( "No options supplied to Opt" );
            for( auto const &name : m_optNames ) {
                if( name.empty() )
                    return Result::logicError( "Option name cannot be empty" );
#ifdef CATCH_PLATFORM_WINDOWS
                if( name[0] != '-' && name[0] != '/' )
                    return Result::logicError( "Option name must begin with '-' or '/'" );
#else
                if( name[0] != '-' )
                    return Result::logicError( "Option name must begin with '-'" );
#endif
            }
            return ParserRefImpl::validate();
        }